

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-quest.c
# Opt level: O2

parser_error parse_quest_place(parser *p)

{
  undefined8 *puVar1;
  _Bool _Var2;
  wchar_t wVar3;
  errr eVar4;
  int iVar5;
  undefined8 in_RAX;
  void *pvVar6;
  char *pcVar7;
  undefined8 *puVar8;
  level_conflict *plVar9;
  undefined1 uVar10;
  parser_error pVar11;
  wchar_t i;
  
  i = (wchar_t)((ulong)in_RAX >> 0x20);
  pvVar6 = parser_priv(p);
  pcVar7 = parser_getsym(p,"locality");
  wVar3 = parser_getint(p,"depth");
  puVar1 = *(undefined8 **)((long)pvVar6 + 0x18);
  if (*(undefined8 **)((long)pvVar6 + 0x18) == (undefined8 *)0x0) {
    __assert_fail("q->place",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-quest.c"
                  ,0x9d,"enum parser_error parse_quest_place(struct parser *)");
  }
  do {
    puVar8 = puVar1;
    puVar1 = (undefined8 *)puVar8[2];
  } while ((undefined8 *)puVar8[2] != (undefined8 *)0x0);
  eVar4 = grab_name("locality",pcVar7,localities,0x27,&i);
  if (eVar4 == 0) {
    pcVar7 = locality_name(i);
    pcVar7 = format("%s %d",pcVar7,(ulong)(uint)wVar3);
    pcVar7 = string_make(pcVar7);
    if ((level_map_conflict *)*puVar8 == (level_map_conflict *)0x0) {
      pVar11 = PARSE_ERROR_INVALID_MAP;
    }
    else {
      plVar9 = level_by_name((level_map_conflict *)*puVar8,pcVar7);
      *(int *)(puVar8 + 1) = plVar9->index;
      string_free(pcVar7);
      _Var2 = parser_hasval(p,"block");
      pVar11 = PARSE_ERROR_NONE;
      uVar10 = 0;
      if (_Var2) {
        pcVar7 = parser_getsym(p,"block");
        iVar5 = strcmp(pcVar7,"block");
        if (iVar5 != 0) {
          return PARSE_ERROR_INVALID_STRING;
        }
        uVar10 = 1;
      }
      *(undefined1 *)((long)puVar8 + 0xc) = uVar10;
    }
  }
  else {
    pVar11 = PARSE_ERROR_INVALID_LOCALITY;
  }
  return pVar11;
}

Assistant:

static enum parser_error parse_quest_place(struct parser *p) {
	struct quest *q = parser_priv(p);
	const char *loc_name = parser_getsym(p, "locality");
	const int depth = parser_getint(p, "depth");
	struct quest_place *q_place = q->place;
	char *lev_name;
	const char *block;
	int i;
	assert(q);
	assert(q->place);

	while (q_place->next) {
		q_place = q_place->next;
	}

	if (grab_name("locality", loc_name, localities, N_ELEMENTS(localities), &i))
		return PARSE_ERROR_INVALID_LOCALITY;
	lev_name = string_make(format("%s %d", locality_name(i), depth));
	if (!q_place->map) return PARSE_ERROR_INVALID_MAP;
	q_place->place = level_by_name(q_place->map, lev_name)->index;
	string_free(lev_name);

	if (parser_hasval(p, "block")) {
		block = parser_getsym(p, "block");
		if (streq(block, "block")) {
			q_place->block = true;
		} else {
			return PARSE_ERROR_INVALID_STRING;
		}
	} else {
		q_place->block = false;
	}
	return PARSE_ERROR_NONE;
}